

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int mtree_entry_tree_add(archive_write *a,mtree_entry_conflict **filep)

{
  mtree_writer *mtree_00;
  mtree_entry_conflict *file_00;
  int iVar1;
  int iVar2;
  archive_write *__s2;
  undefined8 *in_RSI;
  archive *in_RDI;
  archive_string as;
  mtree_entry_conflict *vp;
  int r;
  int l;
  char *p;
  char *fn;
  mtree_entry_conflict *np;
  mtree_entry_conflict *file;
  mtree_entry_conflict *dent;
  mtree_writer *mtree;
  char name [256];
  undefined7 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8f;
  mtree_entry_conflict *in_stack_fffffffffffffe90;
  mtree_entry_conflict *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  mtree_entry_conflict *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  archive_write *a_00;
  archive_write *local_140;
  mtree_entry_conflict *local_138;
  mtree_entry_conflict *local_128;
  char local_118;
  int local_4;
  
  mtree_00 = *(mtree_writer **)&in_RDI[1].current_codepage;
  file_00 = (mtree_entry_conflict *)*in_RSI;
  if ((((file_00->parentdir).length == 0) && ((file_00->basename).length == 1)) &&
     (*(file_00->basename).s == '.')) {
    file_00->parent = file_00;
    if (mtree_00->root == (mtree_entry_conflict *)0x0) {
      mtree_00->root = file_00;
      mtree_entry_register_add(mtree_00,file_00);
      return 0;
    }
    local_138 = mtree_00->root;
  }
  else {
    if ((file_00->parentdir).length == 0) {
      archive_set_error(in_RDI,-1,"Internal programing error in generating canonical name for %s",
                        (file_00->pathname).s);
      return -0x19;
    }
    __s2 = (archive_write *)(file_00->parentdir).s;
    a_00 = __s2;
    if (((mtree_00->cur_dirstr).length == (file_00->parentdir).length) &&
       (iVar1 = strcmp((mtree_00->cur_dirstr).s,(char *)__s2), iVar1 == 0)) {
      iVar1 = __archive_rb_tree_insert_node
                        ((archive_rb_tree *)a_00,
                         (archive_rb_node *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      if (iVar1 != 0) {
        file_00->parent = mtree_00->cur_dirent;
        mtree_entry_register_add(mtree_00,file_00);
        return 0;
      }
      local_138 = (mtree_entry_conflict *)
                  __archive_rb_tree_find_node
                            ((archive_rb_tree *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0)
      ;
    }
    else {
      local_128 = mtree_00->root;
      while (local_140 = __s2,
            iVar1 = get_path_component((char *)in_stack_fffffffffffffea8,
                                       (size_t)in_stack_fffffffffffffea0,
                                       (char *)in_stack_fffffffffffffe98), iVar1 != 0) {
        if (iVar1 < 0) {
          archive_set_error(in_RDI,-1,"A name buffer is too small");
          return -0x1e;
        }
        if (((iVar1 == 1) && (local_118 == '.')) &&
           ((local_128 != (mtree_entry_conflict *)0x0 && (local_128 == mtree_00->root)))) {
          __s2 = (archive_write *)((long)&(local_140->archive).magic + 1);
          if (*(char *)&(__s2->archive).magic == '/') {
            __s2 = (archive_write *)((long)&(local_140->archive).magic + 2);
          }
        }
        else {
          local_138 = mtree_entry_find_child
                                (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
          if ((local_138 == (mtree_entry_conflict *)0x0) ||
             (*(char *)&(local_140->archive).magic == '\0')) goto LAB_002adc52;
          if (local_138->dir_info == (dir_info *)0x0) {
            archive_set_error(in_RDI,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                              (local_138->pathname).s,(file_00->pathname).s);
            return -0x19;
          }
          __s2 = (archive_write *)((long)&(local_140->archive).magic + (long)iVar1);
          local_128 = local_138;
          if (*(char *)&(__s2->archive).magic == '/') {
            __s2 = (archive_write *)((long)&(__s2->archive).magic + 1);
          }
        }
      }
      local_138 = (mtree_entry_conflict *)0x0;
LAB_002adc52:
      if (local_138 == (mtree_entry_conflict *)0x0) {
        while (*(char *)&(local_140->archive).magic != '\0') {
          in_stack_fffffffffffffe90 = (mtree_entry_conflict *)0x0;
          in_stack_fffffffffffffe98 = (mtree_entry_conflict *)0x0;
          in_stack_fffffffffffffea0 = (void *)0x0;
          archive_strncat((archive_string *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8,0);
          if (((undefined1 *)((long)&in_stack_fffffffffffffe98[-1].ino + 7))
              [(long)&in_stack_fffffffffffffe90->rbnode] == '/') {
            ((undefined1 *)((long)&in_stack_fffffffffffffe98[-1].ino + 7))
            [(long)&in_stack_fffffffffffffe90->rbnode] = 0;
            in_stack_fffffffffffffe98 =
                 (mtree_entry_conflict *)((long)&in_stack_fffffffffffffe98[-1].ino + 7);
          }
          in_stack_fffffffffffffeb0 =
               mtree_entry_create_virtual_dir
                         (a_00,(char *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),
                          (mtree_entry_conflict **)in_stack_fffffffffffffea8);
          archive_string_free((archive_string *)0x2add0e);
          if (in_stack_fffffffffffffeb0 < -0x14) {
            return in_stack_fffffffffffffeb0;
          }
          iVar2 = strcmp((in_stack_fffffffffffffea8->pathname).s,".");
          if (iVar2 == 0) {
            in_stack_fffffffffffffea8->parent = in_stack_fffffffffffffea8;
            mtree_00->root = in_stack_fffffffffffffea8;
            local_128 = in_stack_fffffffffffffea8;
          }
          else {
            __archive_rb_tree_insert_node
                      ((archive_rb_tree *)a_00,
                       (archive_rb_node *)CONCAT44(iVar1,in_stack_fffffffffffffeb0));
            in_stack_fffffffffffffea8->parent = local_128;
            local_128 = in_stack_fffffffffffffea8;
          }
          mtree_entry_register_add(mtree_00,local_128);
          local_140 = (archive_write *)((long)&(local_140->archive).magic + (long)iVar1);
          if (*(char *)&(local_140->archive).magic == '/') {
            local_140 = (archive_write *)((long)&(local_140->archive).magic + 1);
          }
          in_stack_fffffffffffffea8 = local_128;
          iVar1 = get_path_component((char *)local_128,(size_t)in_stack_fffffffffffffea0,
                                     (char *)in_stack_fffffffffffffe98);
          if (iVar1 < 0) {
            archive_string_free((archive_string *)0x2addef);
            archive_set_error(in_RDI,-1,"A name buffer is too small");
            return -0x1e;
          }
        }
        mtree_00->cur_dirent = local_128;
        (mtree_00->cur_dirstr).length = 0;
        archive_string_ensure
                  ((archive_string *)in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        if ((local_128->parentdir).length + (local_128->basename).length == 0) {
          *(mtree_00->cur_dirstr).s = '\0';
        }
        else {
          if ((local_128->parentdir).length != 0) {
            (mtree_00->cur_dirstr).length = 0;
            archive_string_concat
                      ((archive_string *)in_stack_fffffffffffffe90,
                       (archive_string *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
            archive_strappend_char
                      ((archive_string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
          }
          archive_string_concat
                    ((archive_string *)in_stack_fffffffffffffe90,
                     (archive_string *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88)
                    );
        }
        iVar1 = __archive_rb_tree_insert_node
                          ((archive_rb_tree *)a_00,
                           (archive_rb_node *)CONCAT44(iVar1,in_stack_fffffffffffffeb0));
        if (iVar1 != 0) {
          file_00->parent = local_128;
          mtree_entry_register_add(mtree_00,file_00);
          return 0;
        }
        local_138 = (mtree_entry_conflict *)
                    __archive_rb_tree_find_node
                              ((archive_rb_tree *)in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0);
      }
    }
  }
  local_4 = mtree_entry_exchange_same_entry
                      ((archive_write *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                       (mtree_entry_conflict *)
                       CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  if (-0x15 < local_4) {
    if (local_138->dir_info != (dir_info *)0x0) {
      local_138->dir_info->virtual = 0;
    }
    *in_RSI = local_138;
    mtree_entry_free((mtree_entry_conflict *)0x2adfaf);
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
mtree_entry_tree_add(struct archive_write *a, struct mtree_entry **filep)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct mtree_writer *mtree = (struct mtree_writer *)a->format_data;
	struct mtree_entry *dent, *file, *np;
	const char *fn, *p;
	int l, r;

	file = *filep;
	if (file->parentdir.length == 0 && file->basename.length == 1 &&
	    file->basename.s[0] == '.') {
		file->parent = file;
		if (mtree->root != NULL) {
			np = mtree->root;
			goto same_entry;
		}
		mtree->root = file;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

	if (file->parentdir.length == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal programing error "
		    "in generating canonical name for %s",
		    file->pathname.s);
		return (ARCHIVE_FAILED);
	}

	fn = p = file->parentdir.s;

	/*
	 * If the path of the parent directory of `file' entry is
	 * the same as the path of `cur_dirent', add `file' entry to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(mtree->cur_dirstr))
	      == archive_strlen(&(file->parentdir)) &&
	    strcmp(mtree->cur_dirstr.s, fn) == 0) {
		if (!__archive_rb_tree_insert_node(
		    &(mtree->cur_dirent->dir_info->rbtree),
		    (struct archive_rb_node *)file)) {
			/* There is the same name in the tree. */
			np = (struct mtree_entry *)__archive_rb_tree_find_node(
			    &(mtree->cur_dirent->dir_info->rbtree),
			    file->basename.s);
			goto same_entry;
		}
		file->parent = mtree->cur_dirent;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

	dent = mtree->root;
	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			return (ARCHIVE_FATAL);
		}
		if (l == 1 && name[0] == '.' && dent != NULL &&
		    dent == mtree->root) {
			fn += l;
			if (fn[0] == '/')
				fn++;
			continue;
		}

		np = mtree_entry_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next sub directory. */
		if (!np->dir_info) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    np->pathname.s, file->pathname.s);
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct mtree_entry *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			r = mtree_entry_create_virtual_dir(a, as.s, &vp);
			archive_string_free(&as);
			if (r < ARCHIVE_WARN)
				return (r);

			if (strcmp(vp->pathname.s, ".") == 0) {
				vp->parent = vp;
				mtree->root = vp;
			} else {
				__archive_rb_tree_insert_node(
				    &(dent->dir_info->rbtree),
				    (struct archive_rb_node *)vp);
				vp->parent = dent;
			}
			mtree_entry_register_add(mtree, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where `file' can be
		 * inserted. */
		mtree->cur_dirent = dent;
		archive_string_empty(&(mtree->cur_dirstr));
		archive_string_ensure(&(mtree->cur_dirstr),
		    archive_strlen(&(dent->parentdir)) +
		    archive_strlen(&(dent->basename)) + 2);
		if (archive_strlen(&(dent->parentdir)) +
		    archive_strlen(&(dent->basename)) == 0)
			mtree->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->parentdir)) > 0) {
				archive_string_copy(&(mtree->cur_dirstr),
				    &(dent->parentdir));
				archive_strappend_char(
				    &(mtree->cur_dirstr), '/');
			}
			archive_string_concat(&(mtree->cur_dirstr),
			    &(dent->basename));
		}

		if (!__archive_rb_tree_insert_node(
		    &(dent->dir_info->rbtree),
		    (struct archive_rb_node *)file)) {
			np = (struct mtree_entry *)__archive_rb_tree_find_node(
			    &(dent->dir_info->rbtree), file->basename.s);
			goto same_entry;
		}
		file->parent = dent;
		mtree_entry_register_add(mtree, file);
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	r = mtree_entry_exchange_same_entry(a, np, file);
	if (r < ARCHIVE_WARN)
		return (r);
	if (np->dir_info)
		np->dir_info->virtual = 0;
	*filep = np;
	mtree_entry_free(file);
	return (ARCHIVE_WARN);
}